

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.c
# Opt level: O1

IceTImage icetSplitCompose(void)

{
  int *piVar1;
  IceTImage image;
  IceTBoolean IVar2;
  int iVar3;
  IceTSizeType IVar4;
  IceTEnum IVar5;
  IceTEnum IVar6;
  IceTInt *pIVar7;
  IceTInt *pIVar8;
  IceTImage IVar9;
  IceTVoid *pIVar10;
  IceTCommRequest pIVar11;
  IceTSparseImage IVar12;
  int iVar13;
  int iVar14;
  int pixels;
  bool bVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  float fVar19;
  float fVar20;
  IceTInt num_tiles;
  IceTSizeType package_size;
  IceTSizeType pixel_size;
  IceTInt num_proc;
  IceTInt max_height;
  IceTInt max_width;
  IceTInt num_contained_tiles;
  IceTInt rank;
  IceTInt tile_displayed;
  IceTInt total_image_count;
  IceTVoid *package_buffer;
  int local_d0;
  IceTSizeType local_cc;
  int local_c8;
  int local_c4;
  IceTBoolean *local_c0;
  int local_b8;
  int local_b4;
  IceTImage local_b0;
  int local_a8;
  int local_a4;
  long local_a0;
  int *local_98;
  ulong local_90;
  int local_84;
  int local_80;
  int local_7c;
  IceTCommRequest local_78;
  IceTCommRequest local_70;
  IceTVoid *local_68;
  ulong local_60;
  IceTCommRequest *local_58;
  IceTImage local_50;
  IceTInt *local_48;
  IceTInt *local_40;
  IceTSparseImage local_38;
  
  icetGetIntegerv(2,&local_a4);
  icetGetIntegerv(3,&local_c4);
  icetGetIntegerv(0x10,&local_d0);
  icetGetIntegerv(0x13,&local_b4);
  icetGetIntegerv(0x14,&local_b8);
  pIVar7 = icetUnsafeStateGetInteger(0x8a);
  icetGetIntegerv(0x8b,&local_7c);
  icetGetIntegerv(0x1b,&local_80);
  pIVar8 = icetUnsafeStateGetInteger(0x11);
  icetGetIntegerv(0x86,&local_a8);
  local_40 = icetUnsafeStateGetInteger(0x87);
  local_c0 = icetUnsafeStateGetBoolean(0x89);
  IVar9 = icetImageNull();
  if (local_7c < 1) {
    if (-1 < local_80) {
      IVar9 = icetGetStateBufferImage
                        (0x1a4,pIVar8[(ulong)(uint)(local_80 << 2) + 2],
                         pIVar8[(ulong)(uint)(local_80 << 2) + 3]);
      icetClearImage(IVar9);
    }
  }
  else {
    local_98 = (int *)icetGetStateBuffer(0x1a6,local_d0 * 4 + 4);
    *local_98 = 0;
    if (local_d0 < 1) {
      iVar13 = 0;
    }
    else {
      lVar17 = 0;
      iVar13 = 0;
      do {
        iVar3 = (local_c4 * pIVar7[lVar17]) / local_7c;
        iVar14 = 1;
        if (1 < iVar3) {
          iVar14 = iVar3;
        }
        if (pIVar7[lVar17] < 1) {
          iVar14 = iVar3;
        }
        local_98[lVar17 + 1] = iVar14;
        lVar17 = lVar17 + 1;
        iVar13 = iVar13 + iVar14;
      } while (lVar17 < local_d0);
    }
    for (; iVar13 < local_c4; iVar13 = iVar13 + 1) {
      if ((long)local_d0 < 1) {
        lVar17 = -1;
      }
      else {
        fVar19 = (float)local_c4;
        uVar16 = 0xffffffff;
        uVar18 = 0;
        do {
          if ((pIVar7[uVar18] != 0) &&
             (fVar20 = (float)local_98[uVar18 + 1] / (float)pIVar7[uVar18], fVar20 < fVar19)) {
            uVar16 = uVar18 & 0xffffffff;
            fVar19 = fVar20;
          }
          uVar18 = uVar18 + 1;
        } while ((long)local_d0 != uVar18);
        lVar17 = (long)(int)uVar16;
      }
      local_98[lVar17 + 1] = local_98[lVar17 + 1] + 1;
    }
    for (; local_c4 < iVar13; iVar13 = iVar13 + -1) {
      if ((long)local_d0 < 1) {
        lVar17 = -1;
      }
      else {
        uVar16 = 0xffffffff;
        fVar19 = 0.0;
        uVar18 = 0;
        do {
          if ((1 < local_98[uVar18 + 1]) &&
             (fVar20 = (float)local_98[uVar18 + 1] / (float)pIVar7[uVar18], fVar19 < fVar20)) {
            uVar16 = uVar18 & 0xffffffff;
            fVar19 = fVar20;
          }
          uVar18 = uVar18 + 1;
        } while ((long)local_d0 != uVar18);
        lVar17 = (long)(int)uVar16;
      }
      local_98[lVar17 + 1] = local_98[lVar17 + 1] + -1;
    }
    if (1 < local_d0) {
      iVar13 = *local_98;
      lVar17 = 1;
      do {
        iVar13 = iVar13 + local_98[lVar17];
        local_98[lVar17] = iVar13;
        lVar17 = lVar17 + 1;
      } while (lVar17 < local_d0);
    }
    local_98[local_d0] = local_c4;
    uVar16 = 0xffffffffffffffff;
    do {
      lVar17 = uVar16 + 2;
      uVar16 = uVar16 + 1;
    } while (local_98[lVar17] <= local_a4);
    uVar18 = uVar16 & 0xffffffff;
    iVar14 = local_98[lVar17] - local_98[uVar18];
    iVar14 = (local_b8 * local_b4 + iVar14 + -1) / iVar14;
    iVar13 = pIVar7[uVar18];
    IVar4 = icetSparseImageBufferSize(iVar14,1);
    local_68 = icetGetStateBuffer(0x1a1,pIVar7[uVar18] << 3);
    local_38 = icetGetStateBufferSparseImage(0x1a2,local_b4,local_b8);
    local_84 = iVar14;
    local_50 = icetGetStateBufferImage(0x1a3,iVar14,1);
    local_b0 = icetGetStateBufferImage(0x1a4,local_b4,local_b8);
    local_58 = (IceTCommRequest *)icetGetStateBuffer(0x1a5,iVar13 << 3);
    local_a0 = CONCAT44(local_a0._4_4_,IVar4);
    pIVar10 = icetGetStateBuffer(0x1a0,pIVar7[uVar18] * IVar4);
    local_60 = uVar18;
    if (0 < pIVar7[uVar18]) {
      lVar17 = (long)(int)local_a0;
      iVar13 = 0;
      iVar14 = 0;
      do {
        if (local_c0[local_d0 * iVar14 + (int)uVar16] != '\0') {
          *(IceTVoid **)((long)local_68 + (long)iVar13 * 8) = pIVar10;
          pIVar11 = icetCommIrecv(pIVar10,(int)local_a0,0x8001,iVar14,0x32);
          local_58[iVar13] = pIVar11;
          iVar13 = iVar13 + 1;
          pIVar10 = (IceTVoid *)((long)pIVar10 + lVar17);
        }
        iVar14 = iVar14 + 1;
      } while (iVar13 < pIVar7[local_60]);
    }
    IVar12.opaque_internals = local_38.opaque_internals;
    IVar9.opaque_internals = local_b0.opaque_internals;
    local_90 = uVar16;
    local_48 = pIVar7;
    if (0 < local_a8) {
      lVar17 = 0;
      do {
        iVar13 = local_40[lVar17];
        local_a0 = lVar17;
        icetGetTileImage(iVar13,IVar9);
        IVar4 = icetImageGetNumPixels(IVar9);
        local_c0 = (IceTBoolean *)(long)iVar13;
        iVar13 = local_98[(long)local_c0];
        iVar14 = local_98[(long)(local_c0 + 1)] - iVar13;
        iVar14 = (IVar4 + iVar14 + -1) / iVar14;
        if (iVar13 < local_98[(long)(local_c0 + 1)]) {
          iVar3 = 0;
          do {
            IVar4 = icetImageGetNumPixels(IVar9);
            pixels = iVar14;
            if (IVar4 - iVar3 < iVar14) {
              IVar4 = icetImageGetNumPixels(IVar9);
              pixels = IVar4 - iVar3;
            }
            icetCompressSubImage(IVar9,iVar3,pixels,IVar12);
            icetSparseImagePackageForSend(IVar12,&local_78,&local_cc);
            icetCommSend(local_78,local_cc,0x8001,iVar13,0x32);
            iVar3 = iVar3 + pixels;
            iVar13 = iVar13 + 1;
          } while (iVar13 < local_98[(long)(local_c0 + 1)]);
        }
        lVar17 = local_a0 + 1;
      } while (lVar17 < local_a8);
    }
    pIVar7 = local_48;
    image.opaque_internals = local_50.opaque_internals;
    uVar16 = local_60;
    pIVar10 = local_68;
    iVar13 = local_48[local_60];
    if (0 < iVar13) {
      iVar14 = 0;
      bVar15 = false;
      do {
        iVar13 = icetCommWaitany(iVar13,local_58);
        IVar12 = icetSparseImageUnpackageFromReceive
                           (*(IceTVoid **)((long)pIVar10 + (long)iVar13 * 8));
        if (bVar15) {
          icetCompressedComposite(image,IVar12,1);
        }
        else {
          icetDecompressImage(IVar12,image);
        }
        iVar14 = iVar14 + 1;
        iVar13 = pIVar7[uVar16];
        bVar15 = true;
      } while (iVar14 < iVar13);
    }
    IVar2 = icetIsEnabled(0x146);
    if (IVar2 == '\0') {
      iVar13 = (local_a4 - local_98[uVar16]) * local_84;
      IVar4 = icetImageGetNumPixels(image);
      IVar9.opaque_internals = local_b0.opaque_internals;
      icetImageCopyPixels(image,0,local_b0,iVar13,IVar4);
      icetStateSetInteger(0x8c,(IceTInt)local_90);
      icetStateSetInteger(0x8d,iVar13);
      icetStateSetInteger(0x8e,IVar4);
    }
    else {
      icetGetIntegerv(0x1b,&local_cc);
      pIVar7 = icetUnsafeStateGetInteger(0x11);
      pIVar8 = icetUnsafeStateGetInteger(0x1a);
      IVar4 = icetImageGetNumPixels(image);
      icetImageAdjustForOutput(image);
      IVar5 = icetImageGetColorFormat(image);
      IVar6 = icetImageGetDepthFormat(image);
      local_c0 = (IceTBoolean *)CONCAT44(local_c0._4_4_,IVar6);
      icetTimingCollectBegin();
      if (IVar5 != 0xc000) {
        pIVar10 = icetImageGetColorVoid(image,&local_c8);
        local_78 = icetCommIsend(pIVar10,local_c8 * IVar4,0x8001,pIVar8[local_90 & 0xffffffff],0x33)
        ;
      }
      if ((int)local_c0 != 0xd000) {
        pIVar10 = icetImageGetDepthVoid(image,&local_c8);
        local_70 = icetCommIsend(pIVar10,IVar4 * local_c8,0x8001,pIVar8[local_90 & 0xffffffff],0x34)
        ;
      }
      piVar1 = local_98;
      IVar9.opaque_internals = local_b0.opaque_internals;
      if (-1 < local_cc) {
        IVar4 = pIVar7[(ulong)(uint)(local_cc << 2) + 2];
        iVar13 = pIVar7[(ulong)(uint)(local_cc << 2) + 3];
        icetImageAdjustForOutput(local_b0);
        icetImageSetDimensions(IVar9,IVar4,iVar13);
        iVar14 = piVar1[(long)local_cc + 1] - piVar1[local_cc];
        if (iVar14 == 0 || piVar1[(long)local_cc + 1] < piVar1[local_cc]) {
          icetClearImage(IVar9);
        }
        else {
          iVar14 = (iVar13 * IVar4 + iVar14 + -1) / iVar14;
          if (IVar5 != 0xc000) {
            pIVar10 = icetImageGetColorVoid(local_b0,&local_c8);
            iVar13 = piVar1[local_cc];
            if (iVar13 < piVar1[(long)local_cc + 1]) {
              do {
                icetCommRecv(pIVar10,local_c8 * iVar14,0x8001,iVar13,0x33);
                pIVar10 = (IceTVoid *)((long)pIVar10 + (long)local_c8 * (long)iVar14);
                iVar13 = iVar13 + 1;
              } while (iVar13 < piVar1[(long)local_cc + 1]);
            }
          }
          if ((int)local_c0 != 0xd000) {
            pIVar10 = icetImageGetDepthVoid(local_b0,&local_c8);
            iVar13 = piVar1[local_cc];
            if (iVar13 < piVar1[(long)local_cc + 1]) {
              do {
                icetCommRecv(pIVar10,local_c8 * iVar14,0x8003,iVar13,0x34);
                pIVar10 = (IceTVoid *)((long)pIVar10 + (long)local_c8 * (long)iVar14);
                iVar13 = iVar13 + 1;
              } while (iVar13 < piVar1[(long)local_cc + 1]);
            }
          }
        }
      }
      if (IVar5 != 0xc000) {
        icetCommWait(&local_78);
      }
      IVar9.opaque_internals = local_b0.opaque_internals;
      if ((int)local_c0 != 0xd000) {
        icetCommWait(&local_70);
      }
      icetTimingCollectEnd();
    }
  }
  return (IceTImage)IVar9.opaque_internals;
}

Assistant:

IceTImage icetSplitCompose(void)
{
    IceTInt *tile_groups;
    IceTInt my_tile;
    IceTInt group_size;
    IceTSizeType my_fragment_size;

    IceTInt rank;
    IceTInt num_proc;
    IceTInt num_tiles;
    IceTInt max_width, max_height;
    const IceTInt *tile_contribs;
    IceTInt total_image_count;
    IceTInt tile_displayed;
    const IceTInt *tile_viewports;
    IceTInt my_width, my_height;

    IceTInt num_contained_tiles;
    const IceTInt *contained_tiles_list;
    const IceTBoolean *all_contained_tiles_masks;

    int tile, image, node;
    int num_allocated;

    IceTSparseImage incoming;
    IceTVoid **incomingBuffers;
    IceTByte *nextInBuf;  /* Use IceTByte for byte-based pointer arithmetic. */
    IceTSparseImage outgoing;
    IceTImage imageFragment;
    IceTImage fullImage;

    IceTSizeType fragmentSparseImageSize;

    int num_requests;
    IceTCommRequest *requests;

    int first_incoming;

    icetRaiseDebug("In splitStrategy");

    icetGetIntegerv(ICET_RANK, &rank);
    icetGetIntegerv(ICET_NUM_PROCESSES, &num_proc);
    icetGetIntegerv(ICET_NUM_TILES, &num_tiles);
    icetGetIntegerv(ICET_TILE_MAX_WIDTH, &max_width);
    icetGetIntegerv(ICET_TILE_MAX_HEIGHT, &max_height);
    tile_contribs = icetUnsafeStateGetInteger(ICET_TILE_CONTRIB_COUNTS);
    icetGetIntegerv(ICET_TOTAL_IMAGE_COUNT, &total_image_count);
    icetGetIntegerv(ICET_TILE_DISPLAYED, &tile_displayed);
    tile_viewports = icetUnsafeStateGetInteger(ICET_TILE_VIEWPORTS);
    icetGetIntegerv(ICET_NUM_CONTAINED_TILES, &num_contained_tiles);
    contained_tiles_list = icetUnsafeStateGetInteger(ICET_CONTAINED_TILES_LIST);
    all_contained_tiles_masks
        = icetUnsafeStateGetBoolean(ICET_ALL_CONTAINED_TILES_MASKS);

    fullImage = icetImageNull();

  /* Special case: no images rendered whatsoever. */
    if (total_image_count < 1) {
        icetRaiseDebug("Not rendering any images.  Quit early.");
        if (tile_displayed >= 0) {
            my_width = tile_viewports[4*tile_displayed + 2];
            my_height = tile_viewports[4*tile_displayed + 3];
            fullImage = icetGetStateBufferImage(SPLIT_FULL_IMAGE_BUFFER,
                                                my_width, my_height);
            icetClearImage(fullImage);
        }
        return fullImage;
    }

    tile_groups = icetGetStateBuffer(SPLIT_TILE_GROUPS_BUFFER,
                                     sizeof(int)*(num_tiles+1));

    num_allocated = 0;
    tile_groups[0] = 0;
  /* Set entry of tile_groups[i+1] to the number of processes to help
     compose the image in tile i. */
  /* TODO: Consider tile sizes when allocating processes. */
    for (tile = 0; tile < num_tiles; tile++) {
        int allocate = (tile_contribs[tile]*num_proc)/total_image_count;
        if ((allocate < 1) && (tile_contribs[tile] > 0)) {
            allocate = 1;
        }
        tile_groups[tile+1] = allocate;
        num_allocated += allocate;
    }

  /* Make the number of processes allocated equal exactly the number of
     processes available. */
    while (num_allocated < num_proc) {
      /* Add processes to the tile with the lowest process:image ratio. */
        int min_id = -1;
        float min_ratio = (float)num_proc;
        for (tile = 0; tile < num_tiles; tile++) {
            float ratio;
          /* Don't even consider tiles with no contributors. */
            if (tile_contribs[tile] == 0) continue;
            ratio = (float)tile_groups[tile+1]/tile_contribs[tile];
            if (ratio < min_ratio) {
                min_ratio = ratio;
                min_id = tile;
            }
        }
#ifdef DEBUG
        if (min_id < 0) {
            icetRaiseError("Could not find candidate to add tile.",
                           ICET_SANITY_CHECK_FAIL);
        }
#endif
        tile_groups[min_id+1]++;
        num_allocated++;
    }
    while (num_allocated > num_proc) {
      /* Remove processes from the tile with the highest process:image
         ratio. */
        int max_id = -1;
        float max_ratio = 0;
        for (tile = 0; tile < num_tiles; tile++) {
            float ratio;
          /* Don't even consider tiles with a minimum allocation. */
            if (tile_groups[tile+1] <= 1) continue;
            ratio = (float)tile_groups[tile+1]/tile_contribs[tile];
            if (ratio > max_ratio) {
                max_ratio = ratio;
                max_id = tile;
            }
        }
#ifdef DEBUG
        if (max_id < 0) {
            icetRaiseError("Could not find candidate to remove tile.",
                           ICET_SANITY_CHECK_FAIL);
        }
#endif
        tile_groups[max_id+1]--;
        num_allocated--;
    }

  /* Processes are assigned sequentially from 0 to N to each tile as
     needed.  Change each tile_groups[i] entry to be the lowest rank of the
     processes assigned to tile i.  Thus the processes assigned to tile i
     are tile_groups[i] through tile_groups[i+1]-1. */
    for (tile = 1; tile < num_tiles; tile++) {
        tile_groups[tile] += tile_groups[tile-1];
    }
    tile_groups[num_tiles] = num_proc;

  /* Figure out which tile I am assigned to. */
    for (my_tile = 0; rank >= tile_groups[my_tile+1]; my_tile++);
    icetRaiseDebug1("My tile is %d", my_tile);

    group_size = tile_groups[my_tile+1] - tile_groups[my_tile];
    my_width = tile_viewports[4*my_tile + 2];
    my_height = tile_viewports[4*my_tile + 3];
    my_fragment_size = FRAG_SIZE(max_width*max_height, group_size);

    num_requests = tile_contribs[my_tile];

    fragmentSparseImageSize = icetSparseImageBufferSize(my_fragment_size, 1);

    incomingBuffers
        = icetGetStateBuffer(SPLIT_INCOMING_ARRAY_BUFFER,
                             sizeof(IceTVoid*)*tile_contribs[my_tile]);
    outgoing      = icetGetStateBufferSparseImage(SPLIT_OUTGOING_BUFFER,
                                                  max_width, max_height);
    imageFragment = icetGetStateBufferImage(SPLIT_IMAGE_FRAGMENT_BUFFER,
                                            my_fragment_size, 1);
    fullImage     = icetGetStateBufferImage(SPLIT_FULL_IMAGE_BUFFER,
                                            max_width, max_height);
    requests = icetGetStateBuffer(SPLIT_REQUEST_BUFFER,
                                  sizeof(IceTCommRequest)*num_requests);

  /* Set up asynchronous receives for all incoming image fragments. */
    nextInBuf = icetGetStateBuffer(SPLIT_INCOMING_BUFFERS,
                                fragmentSparseImageSize*tile_contribs[my_tile]);
    for (image = 0, node = 0; image < tile_contribs[my_tile]; node++) {
        if (all_contained_tiles_masks[node*num_tiles + my_tile]) {
            icetRaiseDebug1("Setting up receive from node %d", node);
            incomingBuffers[image] = nextInBuf;
            requests[image] =
                icetCommIrecv(incomingBuffers[image],
                              fragmentSparseImageSize,
                              ICET_BYTE, node, IMAGE_DATA);
            image++;
            nextInBuf += fragmentSparseImageSize;
        }
    }

  /* Render and send all tile images I am rendering. */
    for (image = 0; image < num_contained_tiles; image++) {
        IceTSizeType sending_frag_size;
        IceTSizeType offset;

        tile = contained_tiles_list[image];
        icetGetTileImage(tile, fullImage);
        icetRaiseDebug1("Rendered image for tile %d", tile);
        offset = 0;
        sending_frag_size = FRAG_SIZE(icetImageGetNumPixels(fullImage),
                                      tile_groups[tile+1]-tile_groups[tile]);
        for (node = tile_groups[tile]; node < tile_groups[tile+1]; node++) {
            IceTVoid *package_buffer;
            IceTSizeType package_size;
            IceTSizeType truncated_size;

            truncated_size = MIN(sending_frag_size,
                                 icetImageGetNumPixels(fullImage) - offset);

            icetRaiseDebug2("Sending tile %d to node %d", tile, node);
            icetRaiseDebug2("Pixels %d to %d",
                            (int)offset, (int)truncated_size-1);
            icetCompressSubImage(fullImage, offset,
                                 truncated_size, outgoing);
            icetSparseImagePackageForSend(outgoing,
                                          &package_buffer, &package_size);
            icetCommSend(package_buffer, package_size,
                         ICET_BYTE, node, IMAGE_DATA);
            offset += truncated_size;
        }
    }

  /* Wait for images to come in and Z compare them. */
    first_incoming = 1;
    for (image = 0; image < tile_contribs[my_tile]; image++) {
        int idx;
        idx = icetCommWaitany(tile_contribs[my_tile], requests);
        incoming = icetSparseImageUnpackageFromReceive(incomingBuffers[idx]);
        if (first_incoming) {
            icetRaiseDebug1("Got first image (%d).", idx);
            icetDecompressImage(incoming, imageFragment);
            first_incoming = 0;
        } else {
            icetRaiseDebug1("Got subsequent image (%d).", idx);
            icetCompressedComposite(imageFragment, incoming, 1);
        }
    }

    if (icetIsEnabled(ICET_COLLECT_IMAGES)) {
        icetCollectImage(imageFragment,
                         my_tile,
                         tile_groups,
                         fullImage);
    } else {
        IceTSizeType offset;

        offset = (rank - tile_groups[my_tile])*my_fragment_size;

        /* Fragment might be truncated.  Adjust my_fragment_size
           appropriately. */
        my_fragment_size = icetImageGetNumPixels(imageFragment);

        icetImageCopyPixels(imageFragment,
                            0,
                            fullImage,
                            offset,
                            my_fragment_size);

        icetStateSetInteger(ICET_VALID_PIXELS_TILE, my_tile);
        icetStateSetInteger(ICET_VALID_PIXELS_OFFSET, offset);
        icetStateSetInteger(ICET_VALID_PIXELS_NUM, my_fragment_size);
    }

    return fullImage;
}